

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall
ON_3dVector::IsPerpendicularTo(ON_3dVector *this,ON_3dVector *v,double angle_tolerance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar7 = Length(this);
  dVar8 = Length(v);
  if ((0.0 < dVar8 * dVar7) &&
     (dVar1 = this->x, dVar2 = this->y, dVar3 = v->y, dVar4 = v->x, dVar5 = this->z, dVar6 = v->z,
     dVar9 = sin(angle_tolerance),
     ABS((dVar5 * dVar6 + dVar1 * dVar4 + dVar2 * dVar3) / (dVar8 * dVar7)) <= dVar9)) {
    return true;
  }
  return false;
}

Assistant:

bool ON_3dVector::IsPerpendicularTo(
      // returns true:  this and other vectors are perpendicular
      //         false: this and other vectors are not perpendicular
      //                or at least one of the vectors is zero
      const ON_3dVector& v,
      double angle_tolerance // (default=ON_DEFAULT_ANGLE_TOLERANCE) radians
      ) const
{
  bool rc = false;
  const double ll = Length()*v.Length();
  if ( ll > 0.0 ) {
    if ( fabs((x*v.x + y*v.y + z*v.z)/ll) <= sin(angle_tolerance) )
      rc = true;
  }
  return rc;
}